

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

CutoffGroup * __thiscall
OpenMD::MoleculeCreator::createCutoffGroup
          (MoleculeCreator *this,Molecule *mol,CutoffGroupStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  int index;
  CutoffGroup *pCVar1;
  size_t sVar2;
  Molecule *in_RSI;
  size_t i;
  Atom *atom;
  CutoffGroup *cg;
  size_t nAtoms;
  Atom *in_stack_ffffffffffffff98;
  CutoffGroup *this_00;
  CutoffGroup *in_stack_ffffffffffffffa0;
  Molecule *this_01;
  undefined8 local_50;
  
  pCVar1 = (CutoffGroup *)operator_new(0x40);
  CutoffGroup::CutoffGroup(in_stack_ffffffffffffffa0);
  sVar2 = CutoffGroupStamp::getNMembers((CutoffGroupStamp *)0x2885d8);
  for (local_50 = 0; local_50 < sVar2; local_50 = local_50 + 1) {
    this_01 = in_RSI;
    CutoffGroupStamp::getMemberAt
              ((CutoffGroupStamp *)in_RSI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    Molecule::getAtomAt(this_01,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    CutoffGroup::addAtom((CutoffGroup *)this_01,in_stack_ffffffffffffff98);
  }
  this_00 = pCVar1;
  index = LocalIndexManager::getNextCutoffGroupIndex((LocalIndexManager *)0x28866f);
  CutoffGroup::setLocalIndex(this_00,index);
  return pCVar1;
}

Assistant:

CutoffGroup* MoleculeCreator::createCutoffGroup(
      Molecule* mol, CutoffGroupStamp* stamp,
      LocalIndexManager* localIndexMan) {
    size_t nAtoms;
    CutoffGroup* cg;
    Atom* atom;
    cg = new CutoffGroup();

    nAtoms = stamp->getNMembers();
    for (size_t i = 0; i < nAtoms; ++i) {
      atom = mol->getAtomAt(stamp->getMemberAt(i));
      assert(atom);
      cg->addAtom(atom);
    }

    // set the local index of this cutoffGroup, global index will be set later
    cg->setLocalIndex(localIndexMan->getNextCutoffGroupIndex());

    return cg;
  }